

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,StringPtr *params,ArrayPtr<const_char> *params_1,
          ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8)

{
  long lVar1;
  size_t size;
  char *target;
  long local_78 [9];
  
  local_78[0] = *(long *)(this + 8) + -1;
  local_78[1] = (params->content).size_;
  local_78[2] = params_1->size_;
  local_78[3] = params_2->size_;
  local_78[4] = params_3->size_;
  local_78[5] = params_4->size_;
  local_78[6] = params_5->size_;
  local_78[7] = params_6->size_;
  local_78[8] = params_7->size_;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_78 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x48);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,(StringPtr *)this,&params->content,params_1,params_2,params_3,params_4,params_5,
             params_6,params_7);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}